

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

char * __thiscall Pathie::Path::dirname(Path *this,char *__path)

{
  int iVar1;
  long lVar2;
  Path *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  iVar1 = std::__cxx11::string::compare(__path);
  if (iVar1 == 0) {
    paVar3 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,".","");
    Path(this,&local_58);
    local_38._M_dataplus._M_p = local_58._M_dataplus._M_p;
  }
  else {
    iVar1 = std::__cxx11::string::compare(__path);
    if (iVar1 == 0) {
      paVar3 = &local_78.field_2;
      local_78._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,".","");
      Path(this,&local_78);
      local_38._M_dataplus._M_p = local_78._M_dataplus._M_p;
    }
    else if ((*(long *)(__path + 8) == 1) && (**(char **)__path == '/')) {
      paVar3 = &local_98.field_2;
      local_98._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,*(long *)__path,*(long *)__path + 1);
      Path(this,&local_98);
      local_38._M_dataplus._M_p = local_98._M_dataplus._M_p;
    }
    else {
      this_00 = (Path *)0x10f1b8;
      lVar2 = std::__cxx11::string::rfind(__path,0x10f1b8,0xffffffffffffffff);
      if (lVar2 != -1) {
        if (lVar2 == 0) {
          root(this,this_00);
          return (char *)this;
        }
        std::__cxx11::string::substr((ulong)&local_38,(ulong)__path);
        Path(this,&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p == &local_38.field_2) {
          return (char *)this;
        }
        goto LAB_00108e6e;
      }
      paVar3 = &local_b8.field_2;
      local_b8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,".","");
      Path(this,&local_b8);
      local_38._M_dataplus._M_p = local_b8._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == paVar3) {
    return (char *)this;
  }
LAB_00108e6e:
  operator_delete(local_38._M_dataplus._M_p);
  return (char *)this;
}

Assistant:

Path Path::dirname() const
{
  if (m_path == ".")
    return Path(".");
  else if (m_path == "..")
    return Path(".");
  else if (is_root())
    return Path(m_path);

  size_t pos = 0;
  if ((pos = m_path.rfind("/")) != string::npos) { // Single = intended
    if (pos == 0) { // /usr
      return root();
    }
#ifdef _WIN32
    else if (pos == 1 && m_path[1] == ':') { // X:/foo
      return root();
    }
#endif
    else { // regular/path or /regular/path
      return Path(m_path.substr(0, pos));
    }
  }